

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::emit_for_loop_initializers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRBlock *block)

{
  size_t sVar1;
  TypedID<(spirv_cross::Types)2> *pTVar2;
  Variant *pVVar3;
  bool bVar4;
  SPIRVariable *pSVar5;
  ulong uVar6;
  SPIRType *pSVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  int iVar9;
  _Alloc_hider _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  if ((block->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
      buffer_size == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    bVar4 = for_loop_initializers_are_same_type(this,block);
    sVar1 = (block->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
            buffer_size;
    if (sVar1 == 0) {
      iVar9 = 0;
    }
    else {
      pTVar2 = (block->loop_variables).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
      lVar11 = 0;
      iVar9 = 0;
      do {
        pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)((long)&pTVar2->id + lVar11));
        uVar6 = (ulong)(pSVar5->static_expression).id;
        if ((uVar6 == 0) ||
           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar6].type ==
            TypeUndef)) {
          iVar9 = iVar9 + 1;
        }
        lVar11 = lVar11 + 4;
      } while (sVar1 << 2 != lVar11);
    }
    sVar1 = (block->loop_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
            buffer_size;
    if (sVar1 == 1 && iVar9 == 0) {
      pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          ((block->loop_variables).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr)->id);
      (*(this->super_Compiler)._vptr_Compiler[0x24])(__return_storage_ptr__,this,pSVar5);
    }
    else if (bVar4 && iVar9 != (int)sVar1) {
      local_38 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (sVar1 != 0) {
        pTVar2 = (block->loop_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
        lVar11 = 0;
        do {
          pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + *(uint *)((long)&pTVar2->id + lVar11));
          uVar6 = (ulong)(pSVar5->static_expression).id;
          if ((uVar6 == 0) ||
             (pVVar3 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar3[uVar6].type == TypeUndef)) {
            pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                               ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>
                                .ptr + *(uint *)((long)&pTVar2->id + lVar11));
            (*(this->super_Compiler)._vptr_Compiler[0x24])(&local_98,this,pSVar5);
            statement<std::__cxx11::string,char_const(&)[2]>(this,&local_98,(char (*) [2])0x2ddbde);
            paVar8 = &local_98.field_2;
            _Var10._M_p = local_98._M_dataplus._M_p;
          }
          else {
            pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                               (pVVar3 + *(uint *)((long)&pTVar2->id + lVar11));
            pSVar7 = Compiler::get_variable_data_type(&this->super_Compiler,pSVar5);
            if (__return_storage_ptr__->_M_string_length == 0) {
              (*(this->super_Compiler)._vptr_Compiler[0x2b])
                        (local_78,this,(ulong)(pSVar5->super_IVariant).self.id);
              (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_58,this,pSVar7,0);
              join<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                        (&local_98,(spirv_cross *)local_78,&local_58,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x2e46c1,(char (*) [2])in_R8);
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p);
              }
              if (local_78[0] != &local_68) {
                operator_delete(local_78[0]);
              }
            }
            else {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              if (pSVar7->pointer == true) {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
            }
            (*(this->super_Compiler)._vptr_Compiler[6])
                      (local_78,this,(ulong)*(uint *)((long)&pTVar2->id + lVar11),1);
            to_pointer_expression_abi_cxx11_(&local_58,this,(pSVar5->static_expression).id,true);
            join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
                      (&local_98,(spirv_cross *)local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f7937
                       ,(char (*) [4])&local_58,in_R8);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p);
            }
            paVar8 = &local_68;
            _Var10._M_p = (pointer)local_78[0];
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != paVar8) {
            operator_delete(_Var10._M_p);
          }
          lVar11 = lVar11 + 4;
        } while (sVar1 << 2 != lVar11);
      }
    }
    else {
      if (sVar1 != 0) {
        pTVar2 = (block->loop_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
        lVar11 = 0;
        do {
          pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                             ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                              ptr + *(uint *)((long)&pTVar2->id + lVar11));
          (*(this->super_Compiler)._vptr_Compiler[0x24])(&local_98,this,pSVar5);
          statement<std::__cxx11::string,char_const(&)[2]>(this,&local_98,(char (*) [2])0x2ddbde);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          lVar11 = lVar11 + 4;
        } while (sVar1 << 2 != lVar11);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::emit_for_loop_initializers(const SPIRBlock &block)
{
	if (block.loop_variables.empty())
		return "";

	bool same_types = for_loop_initializers_are_same_type(block);
	// We can only declare for loop initializers if all variables are of same type.
	// If we cannot do this, declare individual variables before the loop header.

	// We might have a loop variable candidate which was not assigned to for some reason.
	uint32_t missing_initializers = 0;
	for (auto &variable : block.loop_variables)
	{
		uint32_t expr = get<SPIRVariable>(variable).static_expression;

		// Sometimes loop variables are initialized with OpUndef, but we can just declare
		// a plain variable without initializer in this case.
		if (expr == 0 || ir.ids[expr].get_type() == TypeUndef)
			missing_initializers++;
	}

	if (block.loop_variables.size() == 1 && missing_initializers == 0)
	{
		return variable_decl(get<SPIRVariable>(block.loop_variables.front()));
	}
	else if (!same_types || missing_initializers == uint32_t(block.loop_variables.size()))
	{
		for (auto &loop_var : block.loop_variables)
			statement(variable_decl(get<SPIRVariable>(loop_var)), ";");
		return "";
	}
	else
	{
		// We have a mix of loop variables, either ones with a clear initializer, or ones without.
		// Separate the two streams.
		string expr;

		for (auto &loop_var : block.loop_variables)
		{
			uint32_t static_expr = get<SPIRVariable>(loop_var).static_expression;
			if (static_expr == 0 || ir.ids[static_expr].get_type() == TypeUndef)
			{
				statement(variable_decl(get<SPIRVariable>(loop_var)), ";");
			}
			else
			{
				auto &var = get<SPIRVariable>(loop_var);
				auto &type = get_variable_data_type(var);
				if (expr.empty())
				{
					// For loop initializers are of the form <type id = value, id = value, id = value, etc ...
					expr = join(to_qualifiers_glsl(var.self), type_to_glsl(type), " ");
				}
				else
				{
					expr += ", ";
					// In MSL, being based on C++, the asterisk marking a pointer
					// binds to the identifier, not the type.
					if (type.pointer)
						expr += "* ";
				}

				expr += join(to_name(loop_var), " = ", to_pointer_expression(var.static_expression));
			}
		}
		return expr;
	}
}